

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mask.c
# Opt level: O1

void mask_print(FILE *out,uint32_t *mask,int size)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (0 < size) {
    uVar1 = size + 0x1fU >> 5;
    uVar2 = 1;
    if (1 < uVar1) {
      uVar2 = (ulong)uVar1;
    }
    uVar3 = 0;
    do {
      if (uVar3 != 0) {
        fputc(0x20,(FILE *)out);
      }
      fprintf((FILE *)out,"%08x",(ulong)mask[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  return;
}

Assistant:

void mask_print(FILE *out, uint32_t *mask, int size) {
	int rsize = MASK_SIZE(size);
	int i;
	for (i = 0; i < rsize; i++) {
		if (i)
			fprintf(out, " ");
		fprintf (out, "%08"PRIx32, mask[i]);
	}
}